

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_get_serializer_metainfo_f(void *serializer,char *name,int name_length,float *value)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + name_length);
  ser::MetainfoSet::ExtractValue<float>((MetainfoSet *)((long)serializer + 0x10),&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void fs_get_serializer_metainfo_f(void* serializer, const char* name, int name_length, float* value)
{
    Serializer& sp = *reinterpret_cast<Serializer*>(serializer);
    sp.globalMetainfo().ExtractValue(std::string(name, name_length), *value);
}